

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NearestNeighborsIndex::set_allocated_singlekdtreeindex
          (NearestNeighborsIndex *this,SingleKdTreeIndex *singlekdtreeindex)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_IndexType(this);
  if (singlekdtreeindex != (SingleKdTreeIndex *)0x0) {
    submessage_arena =
         google::protobuf::internal::InternalMetadata::owning_arena
                   (&(singlekdtreeindex->super_MessageLite)._internal_metadata_);
    if (message_arena != submessage_arena) {
      singlekdtreeindex =
           (SingleKdTreeIndex *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&singlekdtreeindex->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 0x6e;
    (this->IndexType_).singlekdtreeindex_ = singlekdtreeindex;
  }
  return;
}

Assistant:

void NearestNeighborsIndex::set_allocated_singlekdtreeindex(::CoreML::Specification::SingleKdTreeIndex* singlekdtreeindex) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_IndexType();
  if (singlekdtreeindex) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::SingleKdTreeIndex>::GetOwningArena(singlekdtreeindex);
    if (message_arena != submessage_arena) {
      singlekdtreeindex = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, singlekdtreeindex, submessage_arena);
    }
    set_has_singlekdtreeindex();
    IndexType_.singlekdtreeindex_ = singlekdtreeindex;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.NearestNeighborsIndex.singleKdTreeIndex)
}